

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atom.cpp
# Opt level: O2

void r_code::Atom::Trace(Atom *base,uint16_t count)

{
  ostream *poVar1;
  undefined6 in_register_00000032;
  ulong uVar2;
  
  std::operator<<((ostream *)&std::cout,"--------\n");
  for (uVar2 = 0; (CONCAT62(in_register_00000032,count) & 0xffffffff) != uVar2; uVar2 = uVar2 + 1) {
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(ushort)uVar2);
    std::operator<<(poVar1,"\t");
    trace(base);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    base = base + 1;
  }
  return;
}

Assistant:

void Atom::Trace(Atom *base, uint16_t count)
{
    std::cout << "--------\n";

    for (uint16_t i = 0; i < count; ++i) {
        std::cout << i << "\t";
        base[i].trace();
        std::cout << std::endl;
    }
}